

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldOptions::MergeFrom(FieldOptions *this,FieldOptions *from)

{
  bool bVar1;
  FieldOptions_CType value;
  LogMessage *other;
  string *value_00;
  UnknownFieldSet *this_00;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  FieldOptions *local_18;
  FieldOptions *from_local;
  FieldOptions *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1679);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&this->uninterpreted_option_,&local_18->uninterpreted_option_);
  if ((local_18->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_ctype(local_18);
    if (bVar1) {
      value = ctype(local_18);
      set_ctype(this,value);
    }
    bVar1 = has_packed(local_18);
    if (bVar1) {
      bVar1 = packed(local_18);
      set_packed(this,bVar1);
    }
    bVar1 = has_lazy(local_18);
    if (bVar1) {
      bVar1 = lazy(local_18);
      set_lazy(this,bVar1);
    }
    bVar1 = has_deprecated(local_18);
    if (bVar1) {
      bVar1 = deprecated(local_18);
      set_deprecated(this,bVar1);
    }
    bVar1 = has_experimental_map_key(local_18);
    if (bVar1) {
      value_00 = experimental_map_key_abi_cxx11_(local_18);
      set_experimental_map_key(this,value_00);
    }
    bVar1 = has_weak(local_18);
    if (bVar1) {
      bVar1 = weak(local_18);
      set_weak(this,bVar1);
    }
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&local_18->_extensions_);
  this_00 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_00,other_00);
  return;
}

Assistant:

void FieldOptions::MergeFrom(const FieldOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_ctype()) {
      set_ctype(from.ctype());
    }
    if (from.has_packed()) {
      set_packed(from.packed());
    }
    if (from.has_lazy()) {
      set_lazy(from.lazy());
    }
    if (from.has_deprecated()) {
      set_deprecated(from.deprecated());
    }
    if (from.has_experimental_map_key()) {
      set_experimental_map_key(from.experimental_map_key());
    }
    if (from.has_weak()) {
      set_weak(from.weak());
    }
  }
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}